

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O0

int __thiscall Fl_Text_Display::move_down(Fl_Text_Display *this)

{
  int iVar1;
  int iVar2;
  int lineEnd;
  int nextLineStartPos;
  int visLineNum;
  int newPos;
  int xPos;
  int lineStartPos;
  Fl_Text_Display *this_local;
  
  iVar2 = this->mCursorPos;
  _xPos = this;
  iVar1 = Fl_Text_Buffer::length(this->mBuffer);
  if (iVar2 == iVar1) {
    this_local._4_4_ = 0;
  }
  else {
    iVar2 = position_to_line(this,this->mCursorPos,&lineEnd);
    if (iVar2 == 0) {
      newPos = line_start(this,this->mCursorPos);
      lineEnd = -1;
    }
    else {
      newPos = this->mLineStarts[lineEnd];
    }
    if (this->mCursorPreferredXPos < 0) {
      visLineNum = handle_vline(this,3,newPos,this->mCursorPos - newPos,0,0,0,0,0,0x7fffffff);
    }
    else {
      visLineNum = this->mCursorPreferredXPos;
    }
    iVar2 = skip_lines(this,newPos,1,true);
    iVar1 = line_end(this,iVar2,true);
    nextLineStartPos = handle_vline(this,2,iVar2,iVar1 - iVar2,0,0,0,0,0,visLineNum);
    insert_position(this,nextLineStartPos);
    this->mCursorPreferredXPos = visLineNum;
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Text_Display::move_down() {
  int lineStartPos, xPos, newPos, visLineNum;

  if ( mCursorPos == mBuffer->length() )
    return 0;

  if ( position_to_line( mCursorPos, &visLineNum ) )
    lineStartPos = mLineStarts[ visLineNum ];
  else {
    lineStartPos = line_start( mCursorPos );
    visLineNum = -1;
  }
  if (mCursorPreferredXPos >= 0) {
    xPos = mCursorPreferredXPos;
  } else {
    xPos = handle_vline(GET_WIDTH, lineStartPos, mCursorPos-lineStartPos,
                        0, 0, 0, 0, 0, INT_MAX);
  }

  int nextLineStartPos = skip_lines( lineStartPos, 1, true );
  int lineEnd = line_end(nextLineStartPos, true);
  newPos = handle_vline(FIND_INDEX_FROM_ZERO, nextLineStartPos, lineEnd-nextLineStartPos,
                        0, 0, 0, 0, 0, xPos);

  insert_position( newPos );
  mCursorPreferredXPos = xPos;
  return 1;
}